

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O2

bool __thiscall backward::SourceFile::not_isempty::operator()(not_isempty *this,value_type *p)

{
  pointer pcVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  
  pcVar1 = (p->second)._M_dataplus._M_p;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<backward::SourceFile::not_isspace>>
                    (pcVar1,pcVar1 + (p->second)._M_string_length);
  return _Var2._M_current != (p->second)._M_dataplus._M_p + (p->second)._M_string_length;
}

Assistant:

bool operator()(const lines_t::value_type &p) {
      return !(std::find_if(p.second.begin(), p.second.end(), not_isspace()) ==
               p.second.end());
    }